

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinputsimulatorimpllinux.cpp
# Opt level: O2

void __thiscall
XInputSimulatorImplLinux::keySequence(XInputSimulatorImplLinux *this,string *sequence)

{
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  ostream *poVar7;
  size_type sVar8;
  long lStack_40;
  
  poVar7 = std::operator<<((ostream *)&std::cout,"key seq: ");
  poVar7 = std::operator<<(poVar7,(string *)sequence);
  std::endl<char,std::char_traits<char>>(poVar7);
  pcVar2 = (sequence->_M_dataplus)._M_p;
  sVar3 = sequence->_M_string_length;
  for (sVar8 = 0; sVar3 != sVar8; sVar8 = sVar8 + 1) {
    cVar1 = pcVar2[sVar8];
    poVar7 = std::operator<<((ostream *)&std::cout,"cahr: ");
    poVar7 = std::operator<<(poVar7,cVar1);
    std::endl<char,std::char_traits<char>>(poVar7);
    uVar5 = (*(this->super_XInputSimulatorImpl)._vptr_XInputSimulatorImpl[0xc])
                      (this,(ulong)(uint)(int)cVar1);
    poVar7 = std::operator<<((ostream *)&std::cout,"key code: ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar5);
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = isupper((int)cVar1);
    if (iVar6 == 0) {
      lStack_40 = 0x58;
    }
    else {
      poVar7 = std::operator<<((ostream *)&std::cout,"upper ");
      poVar7 = std::operator<<(poVar7,cVar1);
      std::endl<char,std::char_traits<char>>(poVar7);
      bVar4 = XKeysymToKeycode(this->display,0xffe1);
      (*(this->super_XInputSimulatorImpl)._vptr_XInputSimulatorImpl[9])(this,(ulong)bVar4);
      (*(this->super_XInputSimulatorImpl)._vptr_XInputSimulatorImpl[0xb])(this,(ulong)uVar5);
      bVar4 = XKeysymToKeycode(this->display,0xffe1);
      uVar5 = (uint)bVar4;
      lStack_40 = 0x50;
    }
    (**(code **)((long)(this->super_XInputSimulatorImpl)._vptr_XInputSimulatorImpl + lStack_40))
              (this,uVar5);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  return;
}

Assistant:

void XInputSimulatorImplLinux::keySequence(const std::string &sequence)
{
    std::cout << "key seq: " << sequence << std::endl;

    for(const char c : sequence) {
        std::cout << "cahr: " << c << std::endl;
        int keyCode = this->charToKeyCode(c);
        std::cout << "key code: " << keyCode << std::endl;

        if (isupper(c)) {
            std::cout << "upper " << c << std::endl;

            this->keyDown(XKeysymToKeycode(display, XK_Shift_L));
            this->keyClick(keyCode);
            this->keyUp(XKeysymToKeycode(display, XK_Shift_L));
        }
        else {
            this->keyClick(keyCode);
        }


        std::cout << std::endl;
    }

}